

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

const_iterator __thiscall Json::Value::begin(Value *this)

{
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  const_iterator cVar2;
  ValueConstIterator local_18;
  iterator local_8;
  
  if ((this->value_).map_ == (ObjectValues *)0x0 || (*(ushort *)&this->field_0x8 & 0xfe) != 6) {
    ValueConstIterator::ValueConstIterator(&local_18);
    uVar1 = extraout_RDX;
  }
  else {
    local_8._M_node = (((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    ValueConstIterator::ValueConstIterator(&local_18,&local_8);
    uVar1 = extraout_RDX_00;
  }
  cVar2.super_ValueIteratorBase._9_7_ = (undefined7)((ulong)uVar1 >> 8);
  cVar2.super_ValueIteratorBase.isNull_ = local_18.super_ValueIteratorBase.isNull_;
  cVar2.super_ValueIteratorBase.current_._M_node = local_18.super_ValueIteratorBase.current_._M_node
  ;
  return (const_iterator)cVar2.super_ValueIteratorBase;
}

Assistant:

Value::const_iterator 
Value::begin() const
{
   switch ( type_ )
   {
#ifdef JSON_VALUE_USE_INTERNAL_MAP
   case arrayValue:
      if ( value_.array_ )
      {
         ValueInternalArray::IteratorState it;
         value_.array_->makeBeginIterator( it );
         return const_iterator( it );
      }
      break;
   case objectValue:
      if ( value_.map_ )
      {
         ValueInternalMap::IteratorState it;
         value_.map_->makeBeginIterator( it );
         return const_iterator( it );
      }
      break;
#else
   case arrayValue:
   case objectValue:
      if ( value_.map_ )
         return const_iterator( value_.map_->begin() );
      break;
#endif
   default:
      break;
   }
   return const_iterator();
}